

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSAify.cpp
# Opt level: O0

void __thiscall wasm::SSAify::addPrepends(SSAify *this)

{
  bool bVar1;
  size_type sVar2;
  Block *this_00;
  reference ppEVar3;
  optional<wasm::Type> type_;
  optional<wasm::Type> local_50;
  Expression *local_40;
  Expression *pre;
  iterator __end3;
  iterator __begin3;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *__range3;
  Block *block;
  Builder builder;
  SSAify *this_local;
  
  builder.wasm = (Module *)this;
  sVar2 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::size
                    (&this->functionPrepends);
  if (sVar2 != 0) {
    Builder::Builder((Builder *)&block,this->module);
    this_00 = Builder::makeBlock((Builder *)&block,(Expression *)0x0);
    __end3 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::begin
                       (&this->functionPrepends);
    pre = (Expression *)
          std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::end
                    (&this->functionPrepends);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end3,(__normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                                  *)&pre);
      if (!bVar1) break;
      ppEVar3 = __gnu_cxx::
                __normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                ::operator*(&__end3);
      local_40 = *ppEVar3;
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&(this_00->list).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                 local_40);
      __gnu_cxx::
      __normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
      ::operator++(&__end3);
    }
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&(this_00->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               this->func->body);
    std::optional<wasm::Type>::optional<wasm::Type_&,_true>(&local_50,&this->func->body->type);
    type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._9_7_ = 0;
    type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload =
         local_50.super__Optional_base<wasm::Type,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Type>._M_payload;
    type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_engaged =
         local_50.super__Optional_base<wasm::Type,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Type>._M_engaged;
    Block::finalize(this_00,type_,Unknown);
    this->func->body = (Expression *)this_00;
  }
  return;
}

Assistant:

void addPrepends() {
    if (functionPrepends.size() > 0) {
      Builder builder(*module);
      auto* block = builder.makeBlock();
      for (auto* pre : functionPrepends) {
        block->list.push_back(pre);
      }
      block->list.push_back(func->body);
      block->finalize(func->body->type);
      func->body = block;
    }
  }